

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::Unequip(Character *this,short item,uchar subloc)

{
  size_type sVar1;
  reference pvVar2;
  bool bVar3;
  ulong local_28;
  size_t i;
  uchar subloc_local;
  short item_local;
  Character *this_local;
  
  if (item != 0) {
    for (local_28 = 0; sVar1 = std::array<int,_15UL>::size(&this->paperdoll), local_28 < sVar1;
        local_28 = local_28 + 1) {
      pvVar2 = std::array<int,_15UL>::operator[](&this->paperdoll,local_28);
      if (*pvVar2 == (int)item) {
        bVar3 = true;
        if ((local_28 != 10) && (bVar3 = true, local_28 != 0xc)) {
          bVar3 = local_28 == 0xe;
        }
        if (bVar3 == (bool)subloc) {
          pvVar2 = std::array<int,_15UL>::operator[](&this->paperdoll,local_28);
          *pvVar2 = 0;
          AddItem(this,item,1);
          CalculateStats(this,true);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Character::Unequip(short item, unsigned char subloc)
{
	if (item == 0)
	{
		return false;
	}

	for (std::size_t i = 0; i < this->paperdoll.size(); ++i)
	{
		if (this->paperdoll[i] == item)
		{
			if (((i == Character::Ring2 || i == Character::Armlet2 || i == Character::Bracer2) ? 1 : 0) == subloc)
			{
				this->paperdoll[i] = 0;
				this->AddItem(item, 1);
				this->CalculateStats();
				return true;
			}
		}
	}

	return false;
}